

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

DeviceFeaturesVk
Diligent::PhysicalDeviceFeaturesToDeviceFeaturesVk
          (ExtensionFeatures *ExtFeatures,DEVICE_FEATURE_STATE OptionalState)

{
  ushort uVar1;
  char (*in_RCX) [47];
  ushort uVar2;
  undefined7 in_register_00000031;
  string msg;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,OptionalState) == 0) {
    FormatString<char[26],char[47]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"OptionalState != DEVICE_FEATURE_STATE_DISABLED",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"PhysicalDeviceFeaturesToDeviceFeaturesVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x818);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = (ushort)OptionalState;
  uVar2 = (ushort)OptionalState << 8;
  if ((ExtFeatures->HostImageCopy).hostImageCopy == 0) {
    uVar2 = 0;
  }
  if ((ExtFeatures->DynamicRendering).dynamicRendering == 0) {
    uVar1 = 0;
  }
  return (DeviceFeaturesVk)(uVar1 | uVar2);
}

Assistant:

DeviceFeaturesVk PhysicalDeviceFeaturesToDeviceFeaturesVk(const VulkanUtilities::VulkanPhysicalDevice::ExtensionFeatures& ExtFeatures,
                                                          DEVICE_FEATURE_STATE                                            OptionalState)
{
    VERIFY_EXPR(OptionalState != DEVICE_FEATURE_STATE_DISABLED);

    DeviceFeaturesVk FeaturesVk;

#define INIT_FEATURE(FeatureName, Supported) \
    FeaturesVk.FeatureName = (Supported) ? OptionalState : DEVICE_FEATURE_STATE_DISABLED

    INIT_FEATURE(DynamicRendering, ExtFeatures.DynamicRendering.dynamicRendering != VK_FALSE);
    INIT_FEATURE(HostImageCopy, ExtFeatures.HostImageCopy.hostImageCopy != VK_FALSE);

#undef INIT_FEATURE

    ASSERT_SIZEOF(DeviceFeaturesVk, 2, "Did you add a new feature to DeviceFeaturesVk? Please handle its status here (if necessary).");

    return FeaturesVk;
}